

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>
* __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_>
::Iterator::Current(Iterator *this)

{
  pointer ptVar1;
  undefined8 *puVar2;
  reference ptVar3;
  long in_RDI;
  pointer in_stack_ffffffffffffffd8;
  unique_ptr<const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>,_std::default_delete<const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_>_>
  *in_stack_ffffffffffffffe0;
  
  ptVar1 = std::
           unique_ptr<const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>,_std::default_delete<const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_>_>
           ::get(in_stack_ffffffffffffffe0);
  if (ptVar1 == (pointer)0x0) {
    in_stack_ffffffffffffffe0 =
         (unique_ptr<const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>,_std::default_delete<const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_>_>
          *)(in_RDI + 0x18);
    puVar2 = (undefined8 *)operator_new(0x10);
    ptVar3 = __gnu_cxx::
             __normal_iterator<const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_*,_std::vector<std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>,_std::allocator<std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_>_>_>
             ::operator*((__normal_iterator<const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_*,_std::vector<std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>,_std::allocator<std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_>_>_>
                          *)(in_RDI + 0x10));
    *puVar2 = (ptVar3->
              super__Tuple_impl<0UL,_int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>
              ).super__Tuple_impl<1UL,_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>.
              super__Head_base<1UL,_int_(*)(const_unsigned_short_*,_int,_int_*,_int),_false>.
              _M_head_impl;
    puVar2[1] = (ptVar3->
                super__Tuple_impl<0UL,_int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>
                ).super__Head_base<0UL,_int_(*)(const_unsigned_short_*,_int,_int_*,_int),_false>.
                _M_head_impl;
    std::
    unique_ptr<const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>,_std::default_delete<const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_>_>
    ::reset(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  ptVar1 = std::
           unique_ptr<const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>,_std::default_delete<const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_>_>
           ::get(in_stack_ffffffffffffffe0);
  return ptVar1;
}

Assistant:

const T* Current() const override {
      if (value_.get() == nullptr) value_.reset(new T(*iterator_));
      return value_.get();
    }